

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x_pubkey.cc
# Opt level: O2

void x509_pubkey_changed(X509_PUBKEY *pub)

{
  uint uVar1;
  EVP_PKEY *pkey;
  uint8_t *spki;
  CBS cbs;
  uchar *local_20;
  CBS local_18;
  
  EVP_PKEY_free((EVP_PKEY *)pub->pkey);
  pub->pkey = (EVP_PKEY *)0x0;
  local_20 = (uchar *)0x0;
  uVar1 = i2d_X509_PUBKEY((X509_PUBKEY *)pub,&local_20);
  if (-1 < (int)uVar1) {
    local_18.len = (size_t)uVar1;
    local_18.data = local_20;
    pkey = (EVP_PKEY *)EVP_parse_public_key(&local_18);
    if ((pkey == (EVP_PKEY *)0x0) || (local_18.len != 0)) {
      EVP_PKEY_free(pkey);
    }
    else {
      pub->pkey = (EVP_PKEY *)pkey;
    }
  }
  OPENSSL_free(local_20);
  ERR_clear_error();
  return;
}

Assistant:

static void x509_pubkey_changed(X509_PUBKEY *pub) {
  EVP_PKEY_free(pub->pkey);
  pub->pkey = NULL;

  // Re-encode the |X509_PUBKEY| to DER and parse it with EVP's APIs.
  uint8_t *spki = NULL;
  int spki_len = i2d_X509_PUBKEY(pub, &spki);
  EVP_PKEY *pkey;
  if (spki_len < 0) {
    goto err;
  }

  CBS cbs;
  CBS_init(&cbs, spki, (size_t)spki_len);
  pkey = EVP_parse_public_key(&cbs);
  if (pkey == NULL || CBS_len(&cbs) != 0) {
    EVP_PKEY_free(pkey);
    goto err;
  }

  pub->pkey = pkey;

err:
  OPENSSL_free(spki);
  // If the operation failed, clear errors. An |X509_PUBKEY| whose key we cannot
  // parse is still a valid SPKI. It just cannot be converted to an |EVP_PKEY|.
  ERR_clear_error();
}